

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

ChebyshevExpansion *
ChebTools::ChebyshevExpansion::factoryfFFT
          (ChebyshevExpansion *__return_storage_ptr__,size_t N,VectorXd *f,double xmin,double xmax)

{
  long lVar1;
  Scalar *pSVar2;
  invalid_argument *this;
  ArrayXd ChebCoeffs;
  Index n;
  VectorXd valsUnitDisc;
  VectorXcd FourierCoeffs;
  undefined1 local_198 [8];
  undefined1 auStack_190 [24];
  _Base_ptr local_178;
  variable_if_dynamic<long,__1> vStack_170;
  _Rb_tree_impl<std::less<int>,_true> local_168;
  pointer pcStack_138;
  pointer local_130;
  pointer pcStack_128;
  pointer local_120;
  pointer pcStack_118;
  pointer local_110;
  Type local_108;
  FFT<double,_Eigen::default_fft_impl<double>_> fft;
  MatrixBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *local_30 [2];
  
  lVar1 = (f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (lVar1 == N + 1) {
    fft.m_impl.super_kissfft_impl<double>.m_plans._M_t._M_impl._0_8_ = lVar1 * 2 + -2;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&valsUnitDisc,(long *)&fft);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<long>
              ((Type *)&fft,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&valsUnitDisc,
               (f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
    ;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&fft,f);
    local_108.
    super_Block<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>,__1,_1,_false>
    .
    super_BlockImpl<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>,__1,_1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>,__1,_1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>,__1,_1,_false>,_0>
    .m_data = (PointerType)f;
    Eigen::VectorBlock<const_Eigen::Reverse<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2>,_-1>::
    VectorBlock((VectorBlock<const_Eigen::Reverse<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2>,__1>
                 *)local_198,(Reverse<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2> *)&local_108,
                1,(f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows + -2);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::tail<long>
              ((Type *)&fft,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&valsUnitDisc,
               (f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
               + -2);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Block<Eigen::Reverse<Eigen::Matrix<double,_1,1,0,_1,1>const,2>const,_1,1,false>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&fft,
               (Block<const_Eigen::Reverse<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2>,__1,_1,_false>
                *)local_198);
    auStack_190._16_8_ = auStack_190;
    auStack_190._8_8_ = (_Base_ptr)0x0;
    vStack_170.m_value = 0;
    local_168._0_8_ = 0;
    local_198 = (undefined1  [8])0x0;
    auStack_190._0_8_ = 0;
    local_168.super__Rb_tree_header._M_header._M_left = &local_168.super__Rb_tree_header._M_header;
    local_168.super__Rb_tree_header._M_header._0_8_ = 0;
    local_168.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_168.super__Rb_tree_header._M_node_count = 0;
    pcStack_138 = (pointer)0x0;
    local_130 = (pointer)0x0;
    pcStack_128 = (pointer)0x0;
    local_120 = (pointer)0x0;
    pcStack_118 = (pointer)0x0;
    local_110 = (pointer)0x0;
    local_178 = (_Base_ptr)auStack_190._16_8_;
    local_168.super__Rb_tree_header._M_header._M_right =
         local_168.super__Rb_tree_header._M_header._M_left;
    Eigen::internal::kissfft_impl<double>::kissfft_impl
              ((kissfft_impl<double> *)&fft,(kissfft_impl<double> *)local_198);
    fft.m_flag = 0;
    Eigen::internal::kissfft_impl<double>::~kissfft_impl((kissfft_impl<double> *)local_198);
    local_198 = (undefined1  [8])
                ((f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows * 2 + -2);
    Eigen::Matrix<std::complex<double>,_-1,_1,_0,_-1,_1>::Matrix<long>
              (&FourierCoeffs,(long *)local_198);
    Eigen::FFT<double,Eigen::default_fft_impl<double>>::
    fwd<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<std::complex<double>,_1,1,0,_1,1>>
              ((FFT<double,Eigen::default_fft_impl<double>> *)&fft,
               (MatrixBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *)&FourierCoeffs,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&valsUnitDisc,-1);
    lVar1 = (f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    n = lVar1 + -1;
    local_30[0] = (MatrixBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *)
                  &FourierCoeffs;
    Eigen::
    DenseBase<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_-1,_1,_0,_-1,_1>_>_>
    ::head<long>(&local_108,
                 (DenseBase<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>_>
                  *)local_30,lVar1);
    Eigen::
    MatrixBase<Eigen::Block<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>>,Eigen::Matrix<std::complex<double>,-1,1,0,-1,1>>,-1,1,false>>
    ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)local_198,
                (MatrixBase<Eigen::Block<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>>,Eigen::Matrix<std::complex<double>,_1,1,0,_1,1>>,_1,1,false>>
                 *)&local_108,&n);
    Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>>,Eigen::Matrix<std::complex<double>,_1,1,0,_1,1>>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&ChebCoeffs,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)local_198);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)&ChebCoeffs,0);
    *pSVar2 = *pSVar2 * 0.5;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)&ChebCoeffs,
                        ChebCoeffs.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows + -1);
    *pSVar2 = *pSVar2 * 0.5;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_198,
               (DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)&ChebCoeffs);
    ChebyshevExpansion(__return_storage_ptr__,(vectype *)local_198,xmin,xmax);
    free((void *)local_198);
    free(ChebCoeffs.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(FourierCoeffs.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.
         m_storage.m_data);
    Eigen::internal::kissfft_impl<double>::~kissfft_impl((kissfft_impl<double> *)&fft);
    free(valsUnitDisc.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    return __return_storage_ptr__;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string
            ((string *)&valsUnitDisc,
             (f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108,
                 "Size of f [",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&valsUnitDisc)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108,
                 "] does not equal N+1 with N of ");
  std::__cxx11::to_string((string *)&FourierCoeffs,N);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fft,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&FourierCoeffs
                );
  std::invalid_argument::invalid_argument(this,(string *)&fft);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::factoryfFFT(const std::size_t N, const Eigen::VectorXd& f, const double xmin, const double xmax) {
        if (f.size() != N+1){
            throw std::invalid_argument("Size of f [" + std::to_string(f.size()) + "] does not equal N+1 with N of "+std::to_string(N));
        }
        Eigen::VectorXd valsUnitDisc(2 * f.size() - 2);
        // Starting at x = 1, going to -1, then the same nodes, not including x=-1 and x=1, in the opposite order
        valsUnitDisc.head(f.size()) = f;
        valsUnitDisc.tail(f.size() - 2) = f.reverse().segment(1, f.size() - 2);
        
        Eigen::FFT<double> fft;
        Eigen::VectorXcd FourierCoeffs(2 * f.size() - 2);
        fft.fwd(FourierCoeffs, valsUnitDisc);
        auto n = f.size() - 1;
        Eigen::ArrayXd ChebCoeffs = FourierCoeffs.real().head(n+1)/n;
        ChebCoeffs[0] /= 2;
        ChebCoeffs[ChebCoeffs.size()-1] /= 2;

        return ChebyshevExpansion(ChebCoeffs, xmin, xmax);
    }